

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O2

void __thiscall
chrono::ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Update_auxiliary
          (ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_> *this,double *g_i)

{
  ChVariables *pCVar1;
  byte bVar2;
  Scalar SVar3;
  ChRowVectorN<double,_ChVariableTupleCarrier_1vars<6>::nvars1> *local_70;
  ChRowVectorN<double,_ChVariableTupleCarrier_1vars<6>::nvars1> *local_68;
  ChVectorN<double,_ChVariableTupleCarrier_1vars<6>::nvars1> *local_60;
  void *local_50;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_40 [24];
  
  pCVar1 = this->variables;
  bVar2 = pCVar1->disabled;
  if ((bool)bVar2 == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,6,1,0,6,1>>
              (local_40,&(this->Eq).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,
               (type *)0x0);
    local_70 = &this->Cq;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_68,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_> *)&local_70,
               (type *)0x0);
    (*pCVar1->_vptr_ChVariables[4])
              (pCVar1,local_40,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_68);
    Eigen::internal::handmade_aligned_free(local_50);
    bVar2 = this->variables->disabled;
  }
  if ((bVar2 & 1) == 0) {
    local_68 = &this->Cq;
    local_60 = &this->Eq;
    SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_68);
    *g_i = SVar3 + *g_i;
  }
  return;
}

Assistant:

void Update_auxiliary(double& g_i) {
        // 1- Assuming jacobians are already computed, now compute
        //   the matrices [Eq]=[invM]*[Cq]' and [Eq]
        if (variables->IsActive()) {
            variables->Compute_invMb_v(Eq, Cq.transpose());
        }

        // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
        if (variables->IsActive()) {
            g_i += Cq * Eq;
        }
    }